

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-cardinalities.cc
# Opt level: O0

void __thiscall
testing::anon_unknown_6::BetweenCardinalityImpl::BetweenCardinalityImpl
          (BetweenCardinalityImpl *this,int min,int max)

{
  ostream *poVar1;
  int local_234;
  int local_224;
  string local_210;
  string local_1f0;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  int local_18;
  int local_14;
  int max_local;
  int min_local;
  BetweenCardinalityImpl *this_local;
  
  local_18 = max;
  local_14 = min;
  _max_local = this;
  CardinalityInterface::CardinalityInterface(&this->super_CardinalityInterface);
  (this->super_CardinalityInterface)._vptr_CardinalityInterface =
       (_func_int **)&PTR__BetweenCardinalityImpl_02a4b960;
  if (local_14 < 0) {
    local_224 = 0;
  }
  else {
    local_224 = local_14;
  }
  this->min_ = local_224;
  if (local_18 < this->min_) {
    local_234 = this->min_;
  }
  else {
    local_234 = local_18;
  }
  this->max_ = local_234;
  std::__cxx11::stringstream::stringstream(local_1a0);
  if (local_14 < 0) {
    poVar1 = std::operator<<(local_190,"The invocation lower bound must be >= 0, ");
    poVar1 = std::operator<<(poVar1,"but is actually ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
    std::operator<<(poVar1,".");
    std::__cxx11::stringstream::str();
    internal::Expect(false,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/googletest-src/googlemock/src/gmock-cardinalities.cc"
                     ,0x3a,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  else if (local_18 < 0) {
    poVar1 = std::operator<<(local_190,"The invocation upper bound must be >= 0, ");
    poVar1 = std::operator<<(poVar1,"but is actually ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    std::operator<<(poVar1,".");
    std::__cxx11::stringstream::str();
    internal::Expect(false,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/googletest-src/googlemock/src/gmock-cardinalities.cc"
                     ,0x3e,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  else if (local_18 < local_14) {
    poVar1 = std::operator<<(local_190,"The invocation upper bound (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    poVar1 = std::operator<<(poVar1,") must be >= the invocation lower bound (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
    std::operator<<(poVar1,").");
    std::__cxx11::stringstream::str();
    internal::Expect(false,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/googletest-src/googlemock/src/gmock-cardinalities.cc"
                     ,0x42,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

BetweenCardinalityImpl(int min, int max)
      : min_(min >= 0 ? min : 0), max_(max >= min_ ? max : min_) {
    std::stringstream ss;
    if (min < 0) {
      ss << "The invocation lower bound must be >= 0, "
         << "but is actually " << min << ".";
      internal::Expect(false, __FILE__, __LINE__, ss.str());
    } else if (max < 0) {
      ss << "The invocation upper bound must be >= 0, "
         << "but is actually " << max << ".";
      internal::Expect(false, __FILE__, __LINE__, ss.str());
    } else if (min > max) {
      ss << "The invocation upper bound (" << max
         << ") must be >= the invocation lower bound (" << min << ").";
      internal::Expect(false, __FILE__, __LINE__, ss.str());
    }
  }